

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fBooleanStateQueryTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::BooleanStateQueryTests::init
          (BooleanStateQueryTests *this,EVP_PKEY_CTX *ctx)

{
  Context *context;
  QueryType verifier_00;
  ContextFlags CVar1;
  ApiType AVar2;
  RenderContext *pRVar3;
  IsEnabledStateTestCase *this_00;
  char *pcVar4;
  long lVar5;
  allocator<char> local_111;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  QueryType local_ac;
  char *pcStack_a8;
  QueryType verifier;
  char *verifierSuffix;
  int verifierNdx;
  int testNdx;
  StateBoolean isEnableds [4];
  bool isDebugContext;
  BooleanStateQueryTests *this_local;
  
  pRVar3 = Context::getRenderContext((this->super_TestCaseGroup).m_context);
  isEnableds[3].minimumContext.m_bits = (*pRVar3->_vptr_RenderContext[2])();
  CVar1 = glu::ContextType::getFlags((ContextType *)&isEnableds[3].minimumContext);
  CVar1 = glu::operator&(CVar1,CONTEXT_DEBUG);
  isEnableds[3]._31_1_ = CVar1 != 0;
  _verifierNdx = "sample_mask";
  isEnableds[0].name = "SAMPLE_MASK";
  isEnableds[0].description._0_4_ = 0x8e51;
  isEnableds[0].description._4_1_ = 0;
  isEnableds[0].targetName = (GLenum)glu::ApiType::es(3,1);
  isEnableds[0]._24_8_ = (long)"GL_OES_sample_shading" + 7;
  isEnableds[1].name = "SAMPLE_SHADING";
  isEnableds[1].description._0_4_ = 0x8c36;
  isEnableds[1].description._4_1_ = 0;
  isEnableds[1].targetName = (GLenum)glu::ApiType::es(3,2);
  isEnableds[1]._24_8_ = anon_var_dwarf_8ba58;
  isEnableds[2].name = "DEBUG_OUTPUT";
  isEnableds[2].description._0_4_ = 0x92e0;
  isEnableds[2].description._4_1_ = isEnableds[3]._31_1_ & 1;
  isEnableds[2].targetName = (GLenum)glu::ApiType::es(3,2);
  isEnableds[2]._24_8_ = anon_var_dwarf_8ba86;
  isEnableds[3].name = "DEBUG_OUTPUT_SYNCHRONOUS";
  isEnableds[3].description._0_4_ = 0x8242;
  isEnableds[3].description._4_1_ = 0;
  AVar2 = glu::ApiType::es(3,2);
  verifierSuffix._4_4_ = 0;
  isEnableds[3].targetName = (GLenum)AVar2;
  while ((int)verifierSuffix._4_4_ < 4) {
    for (verifierSuffix._0_4_ = 0; (int)verifierSuffix < 5;
        verifierSuffix._0_4_ = (int)verifierSuffix + 1) {
      pcStack_a8 = anon_unknown_1::getVerifierSuffix(init::isEnabledVerifiers[(int)verifierSuffix]);
      local_ac = init::isEnabledVerifiers[(int)verifierSuffix];
      this_00 = (IsEnabledStateTestCase *)operator_new(0xa0);
      verifier_00 = local_ac;
      context = (this->super_TestCaseGroup).m_context;
      pcVar4 = *(char **)(&verifierNdx + (long)(int)verifierSuffix._4_4_ * 8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,pcVar4,&local_111);
      std::operator+(&local_f0,&local_110,"_");
      std::operator+(&local_d0,&local_f0,pcStack_a8);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      lVar5 = (long)(int)verifierSuffix._4_4_;
      anon_unknown_1::IsEnabledStateTestCase::IsEnabledStateTestCase
                (this_00,context,verifier_00,pcVar4,isEnableds[lVar5].name,
                 *(GLenum *)&isEnableds[lVar5].description,
                 (bool)(*(byte *)((long)&isEnableds[lVar5].description + 4) & 1),
                 (ApiType)isEnableds[lVar5].targetName);
      tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_110);
      std::allocator<char>::~allocator(&local_111);
    }
    AVar2.m_bits = verifierSuffix._4_4_ + 1;
    verifierSuffix._4_4_ = AVar2.m_bits;
  }
  return AVar2.m_bits;
}

Assistant:

void BooleanStateQueryTests::init (void)
{
	const bool isDebugContext = (m_context.getRenderContext().getType().getFlags() & glu::CONTEXT_DEBUG) != 0;

	static const QueryType isEnabledVerifiers[] =
	{
		QUERY_ISENABLED,
		QUERY_BOOLEAN,
		QUERY_INTEGER,
		QUERY_INTEGER64,
		QUERY_FLOAT
	};

#define FOR_EACH_VERIFIER(VERIFIERS, X) \
	for (int verifierNdx = 0; verifierNdx < DE_LENGTH_OF_ARRAY(VERIFIERS); ++verifierNdx)	\
	{																						\
		const char* verifierSuffix = getVerifierSuffix((VERIFIERS)[verifierNdx]);			\
		const QueryType verifier = (VERIFIERS)[verifierNdx];								\
		this->addChild(X);																	\
	}

	struct StateBoolean
	{
		const char*		name;
		const char*		description;
		glw::GLenum		targetName;
		bool			value;
		glu::ApiType	minimumContext;
	};

	{
		const StateBoolean isEnableds[] =
		{
			{ "sample_mask",				"SAMPLE_MASK",				GL_SAMPLE_MASK,					false,			glu::ApiType::es(3, 1)},
			{ "sample_shading",				"SAMPLE_SHADING",			GL_SAMPLE_SHADING,				false,			glu::ApiType::es(3, 2)},
			{ "debug_output",				"DEBUG_OUTPUT",				GL_DEBUG_OUTPUT,				isDebugContext,	glu::ApiType::es(3, 2)},
			{ "debug_output_synchronous",	"DEBUG_OUTPUT_SYNCHRONOUS",	GL_DEBUG_OUTPUT_SYNCHRONOUS,	false,			glu::ApiType::es(3, 2)},
		};

		for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(isEnableds); testNdx++)
		{
			FOR_EACH_VERIFIER(isEnabledVerifiers, new IsEnabledStateTestCase(m_context, verifier, (std::string(isEnableds[testNdx].name) + "_" + verifierSuffix).c_str(), isEnableds[testNdx].description, isEnableds[testNdx].targetName, isEnableds[testNdx].value, isEnableds[testNdx].minimumContext));
		}
	}

#undef FOR_EACH_VERIFIER
}